

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

aiVectorKey * Read<aiVectorKey>(aiVectorKey *__return_storage_ptr__,IOStream *stream)

{
  double dVar1;
  aiVector3D aVar2;
  
  dVar1 = Read<double>(stream);
  __return_storage_ptr__->mTime = dVar1;
  aVar2 = Read<aiVector3t<float>>(stream);
  __return_storage_ptr__->mValue = aVar2;
  return __return_storage_ptr__;
}

Assistant:

aiVectorKey Read<aiVectorKey>(IOStream * stream) {
    aiVectorKey v;
    v.mTime = Read<double>(stream);
    v.mValue = Read<aiVector3D>(stream);
    return v;
}